

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  bool bVar1;
  bool bVar2;
  byte in_CL;
  byte bVar3;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  float fVar4;
  ImGuiWindow *child_window;
  bool ret;
  float backup_border_size;
  char title [256];
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000264;
  bool *in_stack_00000268;
  char *in_stack_00000270;
  ImVec2 *in_stack_fffffffffffffea8;
  ImGuiWindow *window;
  char local_148 [23];
  undefined1 in_stack_fffffffffffffecf;
  ImGuiWindow *in_stack_fffffffffffffed0;
  ImVec2 local_40;
  ImVec2 local_38;
  ImGuiWindow *local_30;
  ImGuiContext *local_28;
  uint local_20;
  byte local_19;
  uint local_c;
  long local_8;
  
  local_19 = in_CL & 1;
  local_28 = GImGui;
  local_30 = GImGui->CurrentWindow;
  local_20 = in_R8D | 0x1000103 | local_30->Flags & 4U;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_38 = GetContentRegionAvail();
  local_40 = ImFloor(in_stack_fffffffffffffea8);
  bVar1 = local_40.x == 0.0;
  bVar3 = 0;
  if (local_40.y == 0.0) {
    bVar3 = 2;
  }
  if (local_40.x <= 0.0) {
    fVar4 = ImMax<float>(local_38.x + local_40.x,4.0);
    local_40.x = fVar4;
  }
  if (local_40.y <= 0.0) {
    fVar4 = ImMax<float>(local_38.y + local_40.y,4.0);
    local_40.y = fVar4;
  }
  SetNextWindowSize(&local_40,0);
  if (local_8 == 0) {
    ImFormatString(local_148,0x100,"%s/%08X",local_30->Name,(ulong)local_c);
  }
  else {
    ImFormatString(local_148,0x100,"%s/%s_%08X",local_30->Name,local_8,(ulong)local_c);
  }
  fVar4 = (local_28->Style).ChildBorderSize;
  if ((local_19 & 1) == 0) {
    (local_28->Style).ChildBorderSize = 0.0;
  }
  bVar2 = Begin(in_stack_00000270,in_stack_00000268,in_stack_00000264);
  (local_28->Style).ChildBorderSize = fVar4;
  window = local_28->CurrentWindow;
  window->ChildId = local_c;
  window->AutoFitChildAxises = bVar1 | bVar3;
  if (window->BeginCount == 1) {
    (local_30->DC).CursorPos = window->Pos;
  }
  if (((local_28->NavActivateId == local_c) && ((local_20 & 0x800000) == 0)) &&
     (((window->DC).NavLayerActiveMask != 0 || (((window->DC).NavHasScroll & 1U) != 0)))) {
    FocusWindow(in_stack_fffffffffffffed0);
    NavInitWindow(in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
    SetActiveID(local_c + 1,window);
    local_28->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(title, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}